

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  uint num_rects;
  ImFontAtlasCustomRect *pIVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  stbrp_rect *rects;
  long lVar7;
  int *piVar8;
  int iVar9;
  stbrp_coord *psVar10;
  long lVar11;
  ulong uVar12;
  ImVector<stbrp_rect> pack_rects;
  
  num_rects = (atlas->CustomRects).Size;
  uVar12 = 8;
  if (8 < num_rects) {
    uVar12 = (ulong)num_rects;
  }
  rects = (stbrp_rect *)ImGui::MemAlloc(uVar12 * 0x18);
  memset(rects,0,(ulong)num_rects * 0x18);
  lVar7 = (long)(atlas->CustomRects).Size;
  if (0 < lVar7) {
    pIVar1 = (atlas->CustomRects).Data;
    psVar10 = &rects->w;
    lVar11 = 0;
    do {
      uVar12 = *(ulong *)((long)&pIVar1->Width + lVar11);
      auVar2._8_4_ = 0;
      auVar2._0_8_ = uVar12;
      auVar2._12_2_ = (short)(uVar12 >> 0x30);
      auVar3._8_2_ = (short)(uVar12 >> 0x20);
      auVar3._0_8_ = uVar12;
      auVar3._10_4_ = auVar2._10_4_;
      auVar6._6_8_ = 0;
      auVar6._0_6_ = auVar3._8_6_;
      auVar4._4_2_ = (short)(uVar12 >> 0x10);
      auVar4._0_4_ = (uint)uVar12;
      auVar4._6_8_ = SUB148(auVar6 << 0x40,6);
      auVar5._4_10_ = auVar4._4_10_;
      auVar5._0_4_ = (uint)uVar12 & 0xffff;
      *(long *)psVar10 = auVar5._0_8_;
      psVar10 = psVar10 + 6;
      lVar11 = lVar11 + 0x20;
    } while (lVar7 * 0x20 != lVar11);
  }
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,rects,num_rects);
  piVar8 = &rects->was_packed;
  lVar7 = 0;
  do {
    if (*piVar8 != 0) {
      pIVar1 = (atlas->CustomRects).Data;
      *(short *)((long)&pIVar1->X + lVar7) = (short)piVar8[-2];
      iVar9 = piVar8[-1];
      *(short *)((long)&pIVar1->Y + lVar7) = (short)iVar9;
      iVar9 = iVar9 + piVar8[-3];
      if (iVar9 < atlas->TexHeight) {
        iVar9 = atlas->TexHeight;
      }
      atlas->TexHeight = iVar9;
    }
    lVar7 = lVar7 + 0x20;
    piVar8 = piVar8 + 6;
  } while ((ulong)num_rects << 5 != lVar7);
  ImGui::MemFree(rects);
  return;
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.
#ifdef __GNUC__
    if (user_rects.Size < 1) { __builtin_unreachable(); } // Workaround for GCC bug if IM_ASSERT() is defined to conditionally throw (see #5343)
#endif

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = (unsigned short)pack_rects[i].x;
            user_rects[i].Y = (unsigned short)pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}